

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O2

vector<int,_std::allocator<int>_> *
read_numbered_sentence
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *line,Dict *sd,
          vector<int,_std::allocator<int>_> *identifiers)

{
  pointer piVar1;
  __type _Var2;
  istream *piVar3;
  int local_1f4;
  string word;
  string sep;
  istringstream in;
  byte abStack_190 [352];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)line,_S_in);
  word._M_dataplus._M_p = (pointer)&word.field_2;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string((string *)&sep,"|||",(allocator *)&local_1f4);
  if ((abStack_190[*(long *)(_in + -0x18)] & 5) == 0) {
    piVar1 = (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_finish != piVar1) {
      (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piVar1;
    }
    while( true ) {
      piVar3 = std::operator>>((istream *)&in,(string *)&word);
      if (((((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) ||
          ((abStack_190[*(long *)(_in + -0x18)] & 5) != 0)) || (word._M_string_length == 0)) break;
      _Var2 = std::operator==(&word,&sep);
      if (_Var2) break;
      local_1f4 = atoi(word._M_dataplus._M_p);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(identifiers,&local_1f4);
    }
  }
  while ((abStack_190[*(long *)(_in + -0x18)] & 5) == 0) {
    std::operator>>((istream *)&in,(string *)&word);
    if (((abStack_190[*(long *)(_in + -0x18)] & 5) != 0) || (word._M_string_length == 0)) break;
    local_1f4 = dynet::Dict::convert(sd,&word);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_1f4);
  }
  std::__cxx11::string::~string((string *)&sep);
  std::__cxx11::string::~string((string *)&word);
  std::__cxx11::istringstream::~istringstream((istringstream *)&in);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> read_numbered_sentence(const std::string& line, Dict* sd, vector<int> &identifiers) {
    std::istringstream in(line);
    std::string word;
    std::vector<int> res;
    std::string sep = "|||";
    if (in) {
        identifiers.clear();
        while (in >> word) {
            if (!in || word.empty()) break;
            if (word == sep) break;
            identifiers.push_back(atoi(word.c_str()));
        }
    }

    while(in) {
        in >> word;
        if (!in || word.empty()) break;
        res.push_back(sd->convert(word));
    }
    return res;
}